

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

bool __thiscall YAML::Emitter::SetBoolFormat(Emitter *this,EMITTER_MANIP value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = EmitterState::SetBoolFormat
                    ((this->m_pState)._M_t.
                     super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                     .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,value,Global);
  bVar2 = EmitterState::SetBoolCaseFormat
                    ((this->m_pState)._M_t.
                     super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                     .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,value,Global);
  bVar3 = EmitterState::SetBoolLengthFormat
                    ((this->m_pState)._M_t.
                     super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                     .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,value,Global);
  return bVar3 || (bVar2 || bVar1);
}

Assistant:

bool Emitter::SetBoolFormat(EMITTER_MANIP value) {
  bool ok = false;
  if (m_pState->SetBoolFormat(value, FmtScope::Global))
    ok = true;
  if (m_pState->SetBoolCaseFormat(value, FmtScope::Global))
    ok = true;
  if (m_pState->SetBoolLengthFormat(value, FmtScope::Global))
    ok = true;
  return ok;
}